

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>
pbrt::Tokenizer::CreateFromFile
          (string *filename,function<void_(const_char_*,_const_pbrt::FileLoc_*)> *errorCallback)

{
  bool bVar1;
  int iVar2;
  char *__file;
  unsigned_long *__args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  _Head_base<0UL,_pbrt::Tokenizer_*,_false> in_RDI;
  void *ptr;
  size_t len;
  stat stat;
  int fd;
  int ch;
  string str;
  char *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  string *psVar3;
  function<void_(const_char_*,_const_pbrt::FileLoc_*)> *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  string local_1b0 [4];
  int in_stack_fffffffffffffe54;
  char *in_stack_fffffffffffffe58;
  LogLevel in_stack_fffffffffffffe64;
  function<void_(const_char_*,_const_pbrt::FileLoc_*)> *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  function<void_(const_char_*,_const_pbrt::FileLoc_*)> *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140 [32];
  stat local_120;
  string local_90 [32];
  string local_70 [32];
  int local_50;
  int local_3c;
  string local_38 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_10 = in_RSI;
  if (LOGGING_LogLevel < 1) {
    Log<std::__cxx11::string_const&>
              (in_stack_fffffffffffffe64,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
               (char *)in_RDI._M_head_impl,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_RDI._M_head_impl);
  }
  bVar1 = std::operator==(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  if (bVar1) {
    std::__cxx11::string::string(local_38);
    while( true ) {
      local_3c = getchar();
      if (local_3c == -1) break;
      std::__cxx11::string::push_back((char)local_38);
    }
    std::
    make_unique<pbrt::Tokenizer,std::__cxx11::string,std::function<void(char_const*,pbrt::FileLoc_const*)>>
              (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    std::__cxx11::string::~string(local_38);
  }
  else {
    __file = (char *)std::__cxx11::string::c_str();
    local_50 = open(__file,0);
    if (local_50 == -1) {
      LastError();
      psVar3 = local_90;
      ErrorString_abi_cxx11_((int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
      StringPrintf<std::__cxx11::string_const&,std::__cxx11::string>
                ((char *)psVar3,local_10,in_stack_fffffffffffffe18);
      std::__cxx11::string::c_str();
      std::function<void_(const_char_*,_const_pbrt::FileLoc_*)>::operator()
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                 (FileLoc *)in_stack_fffffffffffffe00);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_90);
      std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>::
      unique_ptr<std::default_delete<pbrt::Tokenizer>,void>
                ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
                 in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    }
    else {
      iVar2 = fstat(local_50,&local_120);
      if (iVar2 == 0) {
        __args_1 = (unsigned_long *)mmap((void *)0x0,local_120.st_size,1,1,local_50,0);
        iVar2 = close(local_50);
        if (iVar2 == 0) {
          std::
          make_unique<pbrt::Tokenizer,void*&,unsigned_long&,std::__cxx11::string_const&,std::function<void(char_const*,pbrt::FileLoc_const*)>>
                    ((void **)local_120.st_size,__args_1,in_stack_fffffffffffffe88,
                     in_stack_fffffffffffffe80);
        }
        else {
          LastError();
          psVar3 = local_1b0;
          ErrorString_abi_cxx11_((int)((ulong)psVar3 >> 0x20));
          StringPrintf<std::__cxx11::string_const&,std::__cxx11::string>
                    (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
          std::__cxx11::string::c_str();
          std::function<void_(const_char_*,_const_pbrt::FileLoc_*)>::operator()
                    (in_stack_fffffffffffffe10,(char *)psVar3,(FileLoc *)local_10);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffe70);
          std::__cxx11::string::~string(local_1b0);
          std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>::
          unique_ptr<std::default_delete<pbrt::Tokenizer>,void>
                    ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)local_10,
                     in_stack_fffffffffffffdf8);
        }
      }
      else {
        LastError();
        args_1 = &local_160;
        ErrorString_abi_cxx11_((int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
        StringPrintf<std::__cxx11::string_const&,std::__cxx11::string>
                  (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,args_1);
        std::__cxx11::string::c_str();
        std::function<void_(const_char_*,_const_pbrt::FileLoc_*)>::operator()
                  ((function<void_(const_char_*,_const_pbrt::FileLoc_*)> *)local_10,
                   in_stack_fffffffffffffe08,(FileLoc *)in_stack_fffffffffffffe00);
        std::__cxx11::string::~string(local_140);
        std::__cxx11::string::~string((string *)&local_160);
        std::unique_ptr<pbrt::Tokenizer,std::default_delete<pbrt::Tokenizer>>::
        unique_ptr<std::default_delete<pbrt::Tokenizer>,void>
                  ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)
                   in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      }
    }
  }
  return (__uniq_ptr_data<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>,_true,_true>)
         (tuple<pbrt::Tokenizer_*,_std::default_delete<pbrt::Tokenizer>_>)in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<Tokenizer> Tokenizer::CreateFromFile(
    const std::string &filename,
    std::function<void(const char *, const FileLoc *)> errorCallback) {
    LOG_VERBOSE("Creating Tokenizer for %s", filename);
    if (filename == "-") {
        // Handle stdin by slurping everything into a string.
        std::string str;
        int ch;
        while ((ch = getchar()) != EOF)
            str.push_back((char)ch);
        return std::make_unique<Tokenizer>(std::move(str), std::move(errorCallback));
    }

#ifdef PBRT_HAVE_MMAP
    int fd = open(filename.c_str(), O_RDONLY);
    if (fd == -1) {
        errorCallback(StringPrintf("%s: %s", filename, ErrorString()).c_str(), nullptr);
        return nullptr;
    }

    struct stat stat;
    if (fstat(fd, &stat) != 0) {
        errorCallback(StringPrintf("%s: %s", filename, ErrorString()).c_str(), nullptr);
        return nullptr;
    }

    size_t len = stat.st_size;
    void *ptr = mmap(nullptr, len, PROT_READ, MAP_FILE | MAP_SHARED, fd, 0);
    if (close(fd) != 0) {
        errorCallback(StringPrintf("%s: %s", filename, ErrorString()).c_str(), nullptr);
        return nullptr;
    }

    return std::make_unique<Tokenizer>(ptr, len, filename, std::move(errorCallback));
#elif defined(PBRT_IS_WINDOWS)
    auto errorReportLambda = [&errorCallback, &filename]() -> std::unique_ptr<Tokenizer> {
        LPSTR messageBuffer = nullptr;
        FormatMessageA(FORMAT_MESSAGE_ALLOCATE_BUFFER | FORMAT_MESSAGE_FROM_SYSTEM |
                           FORMAT_MESSAGE_IGNORE_INSERTS,
                       NULL, ::GetLastError(), MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT),
                       (LPSTR)&messageBuffer, 0, NULL);

        errorCallback(StringPrintf("%s: %s", filename, messageBuffer).c_str(), nullptr);

        LocalFree(messageBuffer);
        return nullptr;
    };

    HANDLE fileHandle = CreateFileA(filename.c_str(), GENERIC_READ, FILE_SHARE_READ, 0,
                                    OPEN_EXISTING, FILE_ATTRIBUTE_NORMAL, 0);
    if (!fileHandle) {
        return errorReportLambda();
    }

    size_t len = GetFileSize(fileHandle, 0);

    HANDLE mapping = CreateFileMapping(fileHandle, 0, PAGE_READONLY, 0, 0, 0);
    CloseHandle(fileHandle);
    if (mapping == 0) {
        return errorReportLambda();
    }

    LPVOID ptr = MapViewOfFile(mapping, FILE_MAP_READ, 0, 0, 0);
    CloseHandle(mapping);
    if (ptr == nullptr) {
        return errorReportLambda();
    }

    std::string str(static_cast<const char *>(ptr), len);

    return std::make_unique<Tokenizer>(ptr, len, filename, std::move(errorCallback));
#else
    FILE *f = fopen(filename.c_str(), "r");
    if (!f) {
        errorCallback(StringPrintf("%s: %s", filename, ErrorString()).c_str(), nullptr);
        return nullptr;
    }

    std::string str;
    int ch;
    while ((ch = fgetc(f)) != EOF)
        str.push_back(char(ch));
    fclose(f);
    return std::make_unique_ptr<Tokenizer>(std::move(str), std::move(errorCallback));
#endif
}